

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::generateFilterFederate(CommonCore *this)

{
  string *__lhs;
  GlobalFederateId fedID;
  route_id rVar1;
  FilterFederate *pFVar2;
  pthread_t pVar3;
  string_view name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  ActionMessage local_e8;
  
  fedID.gid = (this->filterFedID)._M_i.gid;
  pFVar2 = (FilterFederate *)operator_new(0x4c0);
  __lhs = &(this->super_BrokerBase).identifier;
  std::operator+(&local_1e8,__lhs,"_filters");
  FilterFederate::FilterFederate
            (pFVar2,fedID,(string *)&local_1e8,
             (GlobalBrokerId)(this->super_BrokerBase).global_broker_id_local.gid,&this->super_Core);
  this->filterFed = pFVar2;
  std::__cxx11::string::~string((string *)&local_1e8);
  pVar3 = pthread_self();
  LOCK();
  (this->filterThread)._M_i._M_thread = pVar3;
  UNLOCK();
  LOCK();
  (this->filterFedID)._M_i.gid = fedID.gid;
  UNLOCK();
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
             ::_M_invoke;
  local_128._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
             ::_M_manager;
  local_110 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
              ::_M_invoke;
  local_148._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
              ::_M_manager;
  local_130 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
              ::_M_manager;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
              ::_M_manager;
  local_168._M_unused._M_object = this;
  local_148._M_unused._M_object = this;
  local_128._M_unused._M_object = this;
  local_108._M_unused._M_object = this;
  FilterFederate::setCallbacks
            (this->filterFed,(function<void_(const_helics::ActionMessage_&)> *)&local_108,
             (function<void_(helics::ActionMessage_&&)> *)&local_128,
             (function<void_(const_helics::ActionMessage_&)> *)&local_148,
             (function<void_(helics::ActionMessage_&&)> *)&local_168);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_168);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_148);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_128);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_108);
  (this->super_BrokerBase).hasFilters = true;
  pFVar2 = this->filterFed;
  pFVar2->mHandles = &this->loopHandles;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
              ::_M_manager;
  local_188._M_unused._M_object = this;
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=(&pFVar2->mLogger,
              (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)&local_188);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_188);
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
              ::_M_manager;
  local_1a8._M_unused._M_object = this;
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=(&this->filterFed->mGetAirLock,
            (function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)&local_1a8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
              ::_M_manager;
  local_1c8._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&)>::operator=
            (&this->filterFed->mDeliverMessage,
             (function<void_(helics::ActionMessage_&)> *)&local_1c8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  ActionMessage::ActionMessage(&local_e8,cmd_reg_fed);
  local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0xc0;
  local_e8.dest_id.gid = 0;
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  local_e8.dest_handle.hid = fedID.gid;
  std::operator+(&local_208,__lhs,"_filters");
  name._M_str = local_208._M_dataplus._M_p;
  name._M_len = local_208._M_string_length;
  ActionMessage::name(&local_e8,name);
  std::__cxx11::string::~string((string *)&local_208);
  rVar1 = getRoute(this,(GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
  (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar1.rid,&local_e8);
  if ((this->super_BrokerBase).globalTime == true) {
    pFVar2 = this->filterFed;
    pFVar2->usingGlobalTime = true;
    (pFVar2->mCoord).globalTime = true;
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CommonCore::generateFilterFederate()
{
    auto fid = filterFedID.load();

    filterFed = new FilterFederate(fid, getIdentifier() + "_filters", global_broker_id_local, this);
    filterThread.store(std::this_thread::get_id());
    filterFedID.store(fid);

    filterFed->setCallbacks([this](const ActionMessage& message) { addActionMessage(message); },
                            [this](ActionMessage&& message) {
                                addActionMessage(std::move(message));
                            },
                            [this](const ActionMessage& message) { routeMessage(message); },
                            [this](ActionMessage&& message) { routeMessage(std::move(message)); });
    hasFilters = true;

    filterFed->setHandleManager(&loopHandles);
    filterFed->setLogger([this](int level, std::string_view name, std::string_view message) {
        sendToLogger(global_broker_id_local, level, name, message);
    });
    filterFed->setAirLockFunction([this](int index) { return std::ref(dataAirlocks[index]); });
    filterFed->setDeliver([this](ActionMessage& message) { deliverMessage(message); });
    ActionMessage newFed(CMD_REG_FED);
    setActionFlag(newFed, child_flag);
    setActionFlag(newFed, non_counting_flag);
    newFed.dest_id = parent_broker_id;
    newFed.source_id = global_broker_id_local;
    newFed.setExtraData(fid.baseValue());
    newFed.name(getIdentifier() + "_filters");
    transmit(getRoute(higher_broker_id), newFed);
    if (globalTime) {
        filterFed->useGlobalTimeCoordinator(true);
    }
}